

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O1

Gia_Man_t * Abc_NtkTestTimDeriveGia(Abc_Ntk_t *pNtk,int fVerbose)

{
  void **ppvVar1;
  Gia_Obj_t *pGVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  int iVar4;
  Gia_Man_t *pGVar5;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar6;
  Tim_Man_t *pTVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Int_t *p_00;
  int *piVar9;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar10;
  Vec_Flt_t *vInArrs;
  Vec_Flt_t *vOutReqs;
  void *pvVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int local_64;
  
  iVar3 = Abc_NtkIsTopo(pNtk);
  if (iVar3 == 0) {
    __assert_fail("Abc_NtkIsTopo(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x11a,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  Abc_NtkFillTemp(pNtk);
  pVVar8 = pNtk->vObjs;
  iVar3 = pNtk->vCis->nSize;
  local_64 = pNtk->vCos->nSize;
  iVar13 = pVVar8->nSize;
  if (iVar13 < 1) {
    uVar15 = 0;
  }
  else {
    uVar18 = 0;
    uVar15 = 0;
    do {
      pvVar11 = pVVar8->pArray[uVar18];
      if ((pvVar11 != (void *)0x0) && ((*(uint *)((long)pvVar11 + 0x14) & 0xf) == 7)) {
        uVar12 = 0;
        if ((((uint)(*(int *)((long)pvVar11 + 0x10) * -0x3d70a3d7) >> 3 |
             *(int *)((long)pvVar11 + 0x10) * 0x20000000) < 0x147ae15) &&
           (uVar12 = 0, 0 < *(int *)((long)pvVar11 + 0x1c))) {
          uVar12 = (uint)(*(int *)((long)pvVar11 + 0x1c) < 10);
        }
        *(uint *)((long)pvVar11 + 0x14) = *(uint *)((long)pvVar11 + 0x14) & 0xffffffe7 | uVar12 << 4
        ;
        if (uVar12 != 0) {
          uVar12 = *(uint *)((long)pvVar11 + 0x1c);
          if ((int)uVar15 <= (int)uVar12) {
            uVar15 = uVar12;
          }
          iVar3 = iVar3 + 1;
          local_64 = local_64 + uVar12;
          if (fVerbose != 0) {
            printf("Selecting node %6d as white boxes with %d inputs and %d output.\n",
                   uVar18 & 0xffffffff,(ulong)uVar12,1);
          }
        }
      }
      uVar18 = uVar18 + 1;
      pVVar8 = pNtk->vObjs;
      iVar13 = pVVar8->nSize;
    } while ((long)uVar18 < (long)iVar13);
  }
  pGVar5 = Gia_ManStart(iVar13);
  p = Gia_ManStart(1000);
  iVar13 = iVar3;
  if (0 < iVar3) {
    do {
      pGVar6 = Gia_ManAppendObj(pGVar5);
      uVar18 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(pGVar5->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = pGVar5->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + pGVar5->nObjs <= pGVar6)) goto LAB_002b1b15;
      Vec_IntPush(pGVar5->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      if ((pGVar6 < pGVar5->pObjs) || (pGVar5->pObjs + pGVar5->nObjs <= pGVar6)) goto LAB_002b1b15;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  if (0 < (int)uVar15) {
    do {
      pGVar6 = Gia_ManAppendObj(p);
      uVar18 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar2 = p->pObjs;
      if ((pGVar6 < pGVar2) || (pGVar2 + p->nObjs <= pGVar6)) {
LAB_002b1b15:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
      if ((pGVar6 < p->pObjs) || (p->pObjs + p->nObjs <= pGVar6)) goto LAB_002b1b15;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  Gia_ManHashAlloc(pGVar5);
  Gia_ManHashAlloc(p);
  pTVar7 = Tim_ManStart(iVar3,local_64);
  pVVar8 = pNtk->vCis;
  iVar3 = 0;
  uVar18 = 0;
  if (0 < pVVar8->nSize) {
    uVar18 = 0;
    do {
      if ((long)pGVar5->vCis->nSize <= (long)uVar18) goto LAB_002b1b34;
      iVar13 = pGVar5->vCis->pArray[uVar18];
      if ((iVar13 < 0) || (pGVar5->nObjs <= iVar13)) goto LAB_002b1af6;
      ppvVar1 = pVVar8->pArray + uVar18;
      uVar18 = uVar18 + 1;
      *(int *)((long)*ppvVar1 + 0x40) = iVar13 * 2;
      pVVar8 = pNtk->vCis;
    } while ((long)uVar18 < (long)pVVar8->nSize);
  }
  iVar13 = (int)uVar18;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(4000);
  p_00->pArray = piVar9;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar9 = (int *)malloc(4000);
  p_01->pArray = piVar9;
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    iVar3 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar8->pArray[lVar14];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        if ((*(uint *)&pNode->field_0x14 & 0x10) == 0) {
          iVar4 = Abc_NtkTestTimNodeStrash(pGVar5,pNode);
        }
        else {
          iVar13 = (pNode->vFanins).nSize;
          iVar17 = (int)uVar18;
          Tim_ManCreateBox(pTVar7,iVar3,iVar13,iVar17,1,iVar13,0);
          iVar13 = (pNode->vFanins).nSize;
          if (0 < iVar13) {
            lVar16 = 0;
            do {
              pvVar11 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar16]];
              Vec_IntPush(p_00,*(int *)((long)pvVar11 + 0x40));
              if (p->vCis->nSize <= lVar16) goto LAB_002b1b34;
              iVar4 = p->vCis->pArray[lVar16];
              if ((iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_002b1af6;
              *(int *)((long)pvVar11 + 0x40) = iVar4 * 2;
              lVar16 = lVar16 + 1;
            } while (lVar16 < (pNode->vFanins).nSize);
          }
          iVar4 = Abc_NtkTestTimNodeStrash(p,pNode);
          (pNode->field_6).iTemp = iVar4;
          Vec_IntPush(p_01,iVar4);
          if ((iVar17 < 0) || (pGVar5->vCis->nSize <= iVar17)) {
LAB_002b1b34:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar4 = pGVar5->vCis->pArray[uVar18 & 0xffffffff];
          if ((iVar4 < 0) || (pGVar5->nObjs <= iVar4)) {
LAB_002b1af6:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          iVar3 = iVar3 + iVar13;
          uVar18 = (ulong)(iVar17 + 1);
          iVar4 = iVar4 * 2;
        }
        (pNode->field_6).iTemp = iVar4;
      }
      iVar13 = (int)uVar18;
      lVar14 = lVar14 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar14 < pVVar8->nSize);
  }
  Abc_NtkCleanMarkA(pNtk);
  pVVar8 = pNtk->vCos;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      Gia_ManAppendCo(pGVar5,*(int *)(*(long *)(*(long *)(*(long *)(*pVVar8->pArray[lVar14] + 0x20)
                                                         + 8) +
                                               (long)**(int **)((long)pVVar8->pArray[lVar14] + 0x20)
                                               * 8) + 0x40));
      lVar14 = lVar14 + 1;
      pVVar8 = pNtk->vCos;
    } while (lVar14 < pVVar8->nSize);
  }
  iVar17 = p_00->nSize;
  if (0 < (long)iVar17) {
    piVar9 = p_00->pArray;
    lVar14 = 0;
    do {
      Gia_ManAppendCo(pGVar5,piVar9[lVar14]);
      lVar14 = lVar14 + 1;
    } while (iVar17 != lVar14);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  iVar17 = p_01->nSize;
  if (0 < (long)iVar17) {
    piVar9 = p_01->pArray;
    lVar14 = 0;
    do {
      Gia_ManAppendCo(p,piVar9[lVar14]);
      lVar14 = lVar14 + 1;
    } while (iVar17 != lVar14);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (iVar13 != pGVar5->vCis->nSize - pGVar5->nRegs) {
    __assert_fail("curPi == Gia_ManPiNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x16d,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  if (iVar3 + pNtk->vPos->nSize != pGVar5->vCos->nSize - pGVar5->nRegs) {
    __assert_fail("curPo == Gia_ManPoNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x16e,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  Gia_ManHashStop(pGVar5);
  Gia_ManSetRegNum(pGVar5,0);
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar10 = Gia_ManCleanup(pGVar5);
  Gia_ManStop(pGVar5);
  pGVar5 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  if (pGVar10->pManTime != (void *)0x0) {
    __assert_fail("pGia->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x17c,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  pGVar10->pManTime = pTVar7;
  vInArrs = Abc_NtkTestCreateArrivals(pNtk->vPis->nSize);
  vOutReqs = Abc_NtkTestCreateRequired(pNtk->vPos->nSize);
  Tim_ManPrint((Tim_Man_t *)pGVar10->pManTime);
  pTVar7 = (Tim_Man_t *)pGVar10->pManTime;
  pvVar11 = Abc_FrameReadLibBox();
  Tim_ManCreate(pTVar7,pvVar11,vInArrs,vOutReqs);
  Tim_ManPrint((Tim_Man_t *)pGVar10->pManTime);
  if (vInArrs->pArray != (float *)0x0) {
    free(vInArrs->pArray);
    vInArrs->pArray = (float *)0x0;
  }
  if (vInArrs != (Vec_Flt_t *)0x0) {
    free(vInArrs);
  }
  if (vOutReqs->pArray != (float *)0x0) {
    free(vOutReqs->pArray);
    vOutReqs->pArray = (float *)0x0;
  }
  if (vOutReqs != (Vec_Flt_t *)0x0) {
    free(vOutReqs);
  }
  Gia_AigerWrite(pGVar5,"holes00.aig",0,0);
  pGVar10->pAigExtra = pGVar5;
  return pGVar10;
}

Assistant:

Gia_Man_t * Abc_NtkTestTimDeriveGia( Abc_Ntk_t * pNtk, int fVerbose )
{
    Gia_Man_t * pTemp;
    Gia_Man_t * pGia = NULL;
    Gia_Man_t * pHoles = NULL;
    Tim_Man_t * pTim = NULL;
    Vec_Int_t * vGiaCoLits, * vGiaCoLits2;
    Vec_Flt_t * vArrTimes, * vReqTimes;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Entry, curPi, curPo, BoxUniqueId;
    int nBoxFaninMax = 0;
    assert( Abc_NtkIsTopo(pNtk) );
    Abc_NtkFillTemp( pNtk );

    // create white boxes
    curPi = Abc_NtkCiNum(pNtk);
    curPo = Abc_NtkCoNum(pNtk);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->fMarkA = Abc_NodeIsWhiteBox( pObj );
        if ( !pObj->fMarkA )
            continue;
        nBoxFaninMax  = Abc_MaxInt( nBoxFaninMax, Abc_ObjFaninNum(pObj) );
        curPi++;
        curPo += Abc_ObjFaninNum(pObj);
        if ( fVerbose )
            printf( "Selecting node %6d as white boxes with %d inputs and %d output.\n", i, Abc_ObjFaninNum(pObj), 1 );
    }

    // construct GIA
    pGia = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pHoles = Gia_ManStart( 1000 );
    for ( i = 0; i < curPi; i++ )
        Gia_ManAppendCi(pGia);
    for ( i = 0; i < nBoxFaninMax; i++ )
        Gia_ManAppendCi(pHoles);
    Gia_ManHashAlloc( pGia );
    Gia_ManHashAlloc( pHoles );

    // construct the timing manager
    pTim = Tim_ManStart( curPi, curPo );

    // assign primary inputs
    curPi = 0;
    curPo = 0;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManCi(pGia, curPi++)), 0 );
    // create internal nodes in a topologic order from white boxes
    vGiaCoLits = Vec_IntAlloc( 1000 );
    vGiaCoLits2 = Vec_IntAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !pObj->fMarkA ) // not a white box
        {
            pObj->iTemp = Abc_NtkTestTimNodeStrash( pGia, pObj );
            continue;
        }
        // create box
        BoxUniqueId = Abc_ObjFaninNum(pObj); // in this case, the node size is the ID of its delay table
        Tim_ManCreateBox( pTim, curPo, Abc_ObjFaninNum(pObj), curPi, 1, BoxUniqueId, 0 );
        curPo += Abc_ObjFaninNum(pObj);

        // handle box inputs
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            // save CO drivers for the AIG
            Vec_IntPush( vGiaCoLits, pFanin->iTemp );
            // load CI nodes for the Holes
            pFanin->iTemp = Abc_Var2Lit( Gia_ObjId(pHoles, Gia_ManCi(pHoles, k)), 0 );
        }

        // handle logic of the box
        pObj->iTemp = Abc_NtkTestTimNodeStrash( pHoles, pObj );

        // handle box outputs
        // save CO drivers for the Holes
        Vec_IntPush( vGiaCoLits2, pObj->iTemp );
//        Gia_ManAppendCo( pHoles, pObj->iTemp );
        // load CO drivers for the AIG
        pObj->iTemp = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManCi(pGia, curPi++)), 0 );
    }
    Abc_NtkCleanMarkA( pNtk );
    // create COs of the AIG
    Abc_NtkForEachCo( pNtk, pObj, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pObj)->iTemp );
    Vec_IntForEachEntry( vGiaCoLits, Entry, i )
        Gia_ManAppendCo( pGia, Entry );
    Vec_IntFree( vGiaCoLits );
    // second AIG
    Vec_IntForEachEntry( vGiaCoLits2, Entry, i )
        Gia_ManAppendCo( pHoles, Entry );
    Vec_IntFree( vGiaCoLits2 );
    // check parameters
    curPo += Abc_NtkPoNum( pNtk );
    assert( curPi == Gia_ManPiNum(pGia) );
    assert( curPo == Gia_ManPoNum(pGia) );
    // finalize GIA
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    Gia_ManHashStop( pHoles );
    Gia_ManSetRegNum( pHoles, 0 );

    // clean up GIA
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    pHoles = Gia_ManCleanup( pTemp = pHoles );
    Gia_ManStop( pTemp );

    // attach the timing manager
    assert( pGia->pManTime == NULL );
    pGia->pManTime = pTim;

    // derive hierarchy manager from box info and input/output arrival/required info
    vArrTimes = Abc_NtkTestCreateArrivals( Abc_NtkPiNum(pNtk) );
    vReqTimes = Abc_NtkTestCreateRequired( Abc_NtkPoNum(pNtk) );

    Tim_ManPrint( (Tim_Man_t *)pGia->pManTime );
    Tim_ManCreate( (Tim_Man_t *)pGia->pManTime, Abc_FrameReadLibBox(), vArrTimes, vReqTimes );
    Tim_ManPrint( (Tim_Man_t *)pGia->pManTime );

    Vec_FltFree( vArrTimes );
    Vec_FltFree( vReqTimes );

Gia_AigerWrite( pHoles, "holes00.aig", 0, 0 );

    // return 
    pGia->pAigExtra = pHoles;
    return pGia;
}